

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportFileGenerator::SetImportLinkInterface
          (cmExportFileGenerator *this,string *config,string *suffix,
          PreprocessContext preprocessRule,cmGeneratorTarget *target,ImportPropertyMap *properties,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  cmLinkInterface *pcVar2;
  ImportPropertyMap *pIVar3;
  PolicyStatus PVar4;
  char *pcVar5;
  cmLocalGenerator *this_00;
  ostream *poVar6;
  string *psVar7;
  ulong uVar8;
  mapped_type *this_01;
  bool local_351;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  allocator<char> local_2d9;
  string local_2d8;
  undefined1 local_2b8 [8];
  string prepro;
  string local_278;
  ostringstream local_258 [8];
  ostringstream e;
  cmLocalGenerator *lg;
  undefined1 local_d0 [6];
  bool newCMP0022Behavior;
  char *local_b0;
  char *prop;
  char *local_88;
  char *prop_suffixed;
  char *propContent;
  allocator<char> local_61;
  string local_60;
  cmLinkInterface *local_40;
  cmLinkInterface *iface;
  ImportPropertyMap *properties_local;
  cmGeneratorTarget *target_local;
  string *psStack_20;
  PreprocessContext preprocessRule_local;
  string *suffix_local;
  string *config_local;
  cmExportFileGenerator *this_local;
  
  iface = (cmLinkInterface *)properties;
  properties_local = (ImportPropertyMap *)target;
  target_local._4_4_ = preprocessRule;
  psStack_20 = suffix;
  suffix_local = config;
  config_local = (string *)this;
  local_40 = cmGeneratorTarget::GetLinkInterface(target,config,target);
  pbVar1 = psStack_20;
  pIVar3 = properties_local;
  if (local_40 != (cmLinkInterface *)0x0) {
    if ((local_40->ImplementationIsInterface & 1U) == 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&prop,
                     "LINK_INTERFACE_LIBRARIES",psStack_20);
      pcVar5 = cmGeneratorTarget::GetProperty
                         ((cmGeneratorTarget *)pIVar3,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&prop
                         );
      std::__cxx11::string::~string((string *)&prop);
      pIVar3 = properties_local;
      local_88 = pcVar5;
      prop_suffixed = pcVar5;
      if (pcVar5 == (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_d0,"LINK_INTERFACE_LIBRARIES",(allocator<char> *)((long)&lg + 7))
        ;
        pcVar5 = cmGeneratorTarget::GetProperty((cmGeneratorTarget *)pIVar3,(string *)local_d0);
        std::__cxx11::string::~string((string *)local_d0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&lg + 7));
        local_b0 = pcVar5;
        prop_suffixed = pcVar5;
        if (pcVar5 == (char *)0x0) {
          return;
        }
      }
      PVar4 = cmGeneratorTarget::GetPolicyStatusCMP0022((cmGeneratorTarget *)properties_local);
      local_351 = false;
      if (PVar4 != WARN) {
        PVar4 = cmGeneratorTarget::GetPolicyStatusCMP0022((cmGeneratorTarget *)properties_local);
        local_351 = PVar4 != OLD;
      }
      pcVar2 = iface;
      pcVar5 = prop_suffixed;
      lg._6_1_ = local_351;
      if ((local_351 == false) || ((this->ExportOld & 1U) != 0)) {
        if (*prop_suffixed == '\0') {
          pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&prepro.field_2 + 8);
          std::operator+(pbVar1,"IMPORTED_LINK_INTERFACE_LIBRARIES",psStack_20);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)pcVar2,pbVar1);
          std::__cxx11::string::clear();
          std::__cxx11::string::~string((string *)(prepro.field_2._M_local_buf + 8));
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,pcVar5,&local_2d9)
          ;
          cmGeneratorExpression::Preprocess((string *)local_2b8,&local_2d8,target_local._4_4_,false)
          ;
          std::__cxx11::string::~string((string *)&local_2d8);
          std::allocator<char>::~allocator(&local_2d9);
          uVar8 = std::__cxx11::string::empty();
          if ((uVar8 & 1) == 0) {
            ResolveTargetsInGeneratorExpressions
                      (this,(string *)local_2b8,(cmGeneratorTarget *)properties_local,missingTargets
                       ,ReplaceFreeTargets);
            pcVar2 = iface;
            std::operator+(&local_300,"IMPORTED_LINK_INTERFACE_LIBRARIES",psStack_20);
            this_01 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)pcVar2,&local_300);
            std::__cxx11::string::operator=((string *)this_01,(string *)local_2b8);
            std::__cxx11::string::~string((string *)&local_300);
          }
          std::__cxx11::string::~string((string *)local_2b8);
        }
      }
      else {
        this_00 = cmGeneratorTarget::GetLocalGenerator((cmGeneratorTarget *)properties_local);
        std::__cxx11::ostringstream::ostringstream(local_258);
        poVar6 = std::operator<<((ostream *)local_258,"Target \"");
        psVar7 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)properties_local);
        poVar6 = std::operator<<(poVar6,(string *)psVar7);
        std::operator<<(poVar6,
                        "\" has policy CMP0022 enabled, but also has old-style LINK_INTERFACE_LIBRARIES properties populated, but it was exported without the EXPORT_LINK_INTERFACE_LIBRARIES to export the old-style properties"
                       );
        std::__cxx11::ostringstream::str();
        cmLocalGenerator::IssueMessage(this_00,FATAL_ERROR,&local_278);
        std::__cxx11::string::~string((string *)&local_278);
        std::__cxx11::ostringstream::~ostringstream(local_258);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,"IMPORTED_LINK_INTERFACE_LIBRARIES",&local_61);
      SetImportLinkProperty<cmLinkItem>
                (this,pbVar1,(cmGeneratorTarget *)pIVar3,&local_60,
                 (vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)local_40,
                 (ImportPropertyMap *)iface,missingTargets);
      std::__cxx11::string::~string((string *)&local_60);
      std::allocator<char>::~allocator(&local_61);
    }
  }
  return;
}

Assistant:

void cmExportFileGenerator::SetImportLinkInterface(
  const std::string& config, std::string const& suffix,
  cmGeneratorExpression::PreprocessContext preprocessRule,
  cmGeneratorTarget* target, ImportPropertyMap& properties,
  std::vector<std::string>& missingTargets)
{
  // Add the transitive link dependencies for this configuration.
  cmLinkInterface const* iface = target->GetLinkInterface(config, target);
  if (!iface) {
    return;
  }

  if (iface->ImplementationIsInterface) {
    // Policy CMP0022 must not be NEW.
    this->SetImportLinkProperty(suffix, target,
                                "IMPORTED_LINK_INTERFACE_LIBRARIES",
                                iface->Libraries, properties, missingTargets);
    return;
  }

  const char* propContent;

  if (const char* prop_suffixed =
        target->GetProperty("LINK_INTERFACE_LIBRARIES" + suffix)) {
    propContent = prop_suffixed;
  } else if (const char* prop =
               target->GetProperty("LINK_INTERFACE_LIBRARIES")) {
    propContent = prop;
  } else {
    return;
  }

  const bool newCMP0022Behavior =
    target->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
    target->GetPolicyStatusCMP0022() != cmPolicies::OLD;

  if (newCMP0022Behavior && !this->ExportOld) {
    cmLocalGenerator* lg = target->GetLocalGenerator();
    std::ostringstream e;
    e << "Target \"" << target->GetName()
      << "\" has policy CMP0022 enabled, "
         "but also has old-style LINK_INTERFACE_LIBRARIES properties "
         "populated, but it was exported without the "
         "EXPORT_LINK_INTERFACE_LIBRARIES to export the old-style properties";
    lg->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }

  if (!*propContent) {
    properties["IMPORTED_LINK_INTERFACE_LIBRARIES" + suffix].clear();
    return;
  }

  std::string prepro =
    cmGeneratorExpression::Preprocess(propContent, preprocessRule);
  if (!prepro.empty()) {
    this->ResolveTargetsInGeneratorExpressions(prepro, target, missingTargets,
                                               ReplaceFreeTargets);
    properties["IMPORTED_LINK_INTERFACE_LIBRARIES" + suffix] = prepro;
  }
}